

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# httplib.h
# Opt level: O0

ssize_t __thiscall
httplib::detail::BufferStream::read(BufferStream *this,int __fd,void *__buf,size_t __nbytes)

{
  int iVar1;
  undefined4 extraout_var;
  undefined4 in_register_00000034;
  size_type len_read;
  size_t size_local;
  char *ptr_local;
  BufferStream *this_local;
  
  iVar1 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::copy
                    (&this->buffer,(EVP_PKEY_CTX *)CONCAT44(in_register_00000034,__fd),
                     (EVP_PKEY_CTX *)__buf);
  this->position = CONCAT44(extraout_var,iVar1) + this->position;
  return CONCAT44(extraout_var,iVar1);
}

Assistant:

inline ssize_t BufferStream::read(char *ptr, size_t size) {
#if defined(_MSC_VER) && _MSC_VER < 1910
  auto len_read = buffer._Copy_s(ptr, size, size, position);
#else
  auto len_read = buffer.copy(ptr, size, position);
#endif
  position += static_cast<size_t>(len_read);
  return static_cast<ssize_t>(len_read);
}